

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O3

void __thiscall
CCompExp::CCompExp(CCompExp *this,IExpression *leftOperand,IExpression *rightOperand,
                  TCompareOperation operation)

{
  IExpression *pIVar1;
  pointer *__ptr;
  PositionInfo PVar2;
  
  (this->super_IExpression).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_001802b0;
  (this->leftOperand)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>.
  _M_t.super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = (IExpression *)0x0;
  (this->rightOperand)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>.
  _M_t.super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = (IExpression *)0x0;
  PVar2 = PositionInfo::operator+
                    (&(leftOperand->super_PositionedNode).position,
                     &(rightOperand->super_PositionedNode).position);
  (this->super_IExpression).super_PositionedNode.position = PVar2;
  pIVar1 = (this->leftOperand)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (this->leftOperand)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>.
  _M_t.super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = leftOperand;
  if (pIVar1 != (IExpression *)0x0) {
    (**(code **)(*(long *)&(pIVar1->super_PositionedNode).super_INode + 0x10))();
  }
  pIVar1 = (this->rightOperand)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (this->rightOperand)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>.
  _M_t.super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = rightOperand;
  if (pIVar1 != (IExpression *)0x0) {
    (**(code **)(*(long *)&(pIVar1->super_PositionedNode).super_INode + 0x10))();
  }
  this->operation = operation;
  return;
}

Assistant:

CCompExp::CCompExp(
        IExpression *leftOperand,
        IExpression *rightOperand,
        enums::TCompareOperation operation
) {
    this->position = leftOperand->position + rightOperand->position;
    this->leftOperand = std::unique_ptr<IExpression>( leftOperand );
    this->rightOperand = std::unique_ptr<IExpression>( rightOperand );
    this->operation = operation;
}